

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::TiledRgbaOutputFile::TiledRgbaOutputFile
          (TiledRgbaOutputFile *this,OStream *os,Header *header,RgbaChannels rgbaChannels,
          int tileXSize,int tileYSize,LevelMode mode,LevelRoundingMode rmode,int numThreads)

{
  char *fileName;
  TiledOutputFile *this_00;
  ToYa *this_01;
  Header local_70;
  TileDescription local_38;
  
  this->_vptr_TiledRgbaOutputFile = (_func_int **)&PTR__TiledRgbaOutputFile_001e44c0;
  this->_outputFile = (TiledOutputFile *)0x0;
  this->_toYa = (ToYa *)0x0;
  Header::Header(&local_70,header);
  fileName = OStream::fileName(os);
  anon_unknown_23::insertChannels(&local_70,rgbaChannels,fileName);
  local_38.mode = mode;
  local_38.roundingMode = rmode;
  local_38.xSize = tileXSize;
  local_38.ySize = tileYSize;
  Header::setTileDescription(&local_70,&local_38);
  this_00 = (TiledOutputFile *)operator_new(0x20);
  TiledOutputFile::TiledOutputFile(this_00,os,&local_70,numThreads);
  this->_outputFile = this_00;
  if ((rgbaChannels & WRITE_Y) != 0) {
    this_01 = (ToYa *)operator_new(0x78);
    ToYa::ToYa(this_01,this_00,rgbaChannels);
    this->_toYa = this_01;
  }
  Header::~Header(&local_70);
  return;
}

Assistant:

TiledRgbaOutputFile::TiledRgbaOutputFile (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os,
    const Header&                            header,
    RgbaChannels                             rgbaChannels,
    int                                      tileXSize,
    int                                      tileYSize,
    LevelMode                                mode,
    LevelRoundingMode                        rmode,
    int                                      numThreads)
    : _outputFile (0), _toYa (0)
{
    Header hd (header);
    insertChannels (hd, rgbaChannels, os.fileName ());
    hd.setTileDescription (TileDescription (tileXSize, tileYSize, mode, rmode));
    _outputFile = new TiledOutputFile (os, hd, numThreads);

    if (rgbaChannels & WRITE_Y) _toYa = new ToYa (*_outputFile, rgbaChannels);
}